

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prngEchoStart(void *state,void *seed,size_t seed_len)

{
  prng_echo_st *s;
  size_t seed_len_local;
  void *seed_local;
  void *state_local;
  
  *(void **)state = seed;
  *(size_t *)((long)state + 8) = seed_len;
  *(undefined8 *)((long)state + 0x10) = 0;
  return;
}

Assistant:

void prngEchoStart(void* state, const void* seed, size_t seed_len)
{
	prng_echo_st* s = (prng_echo_st*)state;
	ASSERT(memIsValid(s, sizeof(prng_echo_st)));
	ASSERT(seed_len > 0);
	ASSERT(memIsValid(seed, seed_len));
	// инициализировать
	s->seed = (const octet*)seed;
	s->seed_len = seed_len;
	s->pos = 0;
}